

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool __thiscall tinygltf::Asset::operator==(Asset *this,Asset *other)

{
  __type _Var1;
  bool bVar2;
  Value *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  Value *in_stack_ffffffffffffffd8;
  undefined1 local_11;
  Value *__rhs;
  
  __rhs = in_RDI;
  _Var1 = std::operator==(unaff_retaddr,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_RDI);
  local_11 = false;
  if (_Var1) {
    bVar2 = std::operator==((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
                             *)in_RDI,
                            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
                             *)in_stack_ffffffffffffffd8);
    local_11 = false;
    if (bVar2) {
      bVar2 = Value::operator==(in_RDI,in_stack_ffffffffffffffd8);
      local_11 = false;
      if (bVar2) {
        _Var1 = std::operator==(unaff_retaddr,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__rhs);
        local_11 = false;
        if (_Var1) {
          _Var1 = std::operator==(unaff_retaddr,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__rhs);
          local_11 = false;
          if (_Var1) {
            local_11 = std::operator==(unaff_retaddr,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)__rhs);
          }
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool Asset::operator==(const Asset &other) const {
  return this->copyright == other.copyright &&
         this->extensions == other.extensions && this->extras == other.extras &&
         this->generator == other.generator &&
         this->minVersion == other.minVersion && this->version == other.version;
}